

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * sx_trim_whitespace(char *dest,int dest_sz,char *src)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  uVar2 = sx_strlen(src);
  uVar1 = dest_sz - 1U;
  if ((int)uVar2 < (int)(dest_sz - 1U)) {
    uVar1 = uVar2;
  }
  uVar3 = 0;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  iVar4 = 0;
  for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    uVar2 = (int)src[uVar3] - 1;
    if ((0x1f < uVar2) || ((0x80001f00U >> (uVar2 & 0x1f) & 1) == 0)) {
      dest[iVar4] = src[uVar3];
      iVar4 = iVar4 + 1;
    }
  }
  dest[iVar4] = '\0';
  return dest;
}

Assistant:

char* sx_trim_whitespace(char* dest, int dest_sz, const char* src)
{
    int len = sx_min(sx_strlen(src), dest_sz - 1);
    int offset = 0;
    for (int i = 0; i < len; i++) {
        if (!sx_isspace(src[i]))
            dest[offset++] = src[i];
    }
    dest[offset] = '\0';
    return dest;
}